

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall QTabBar::setTabVisible(QTabBar *this,int index,bool visible)

{
  QTabBarPrivate *this_00;
  QWidget *pQVar1;
  byte bVar2;
  int index_00;
  Tab *pTVar3;
  
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if ((ulong)(long)index < (ulong)(this_00->tabList).d.size) {
    pTVar3 = (this_00->tabList).d.ptr[index];
  }
  else {
    pTVar3 = (Tab *)0x0;
  }
  if ((pTVar3 != (Tab *)0x0) &&
     (bVar2 = (pTVar3->field_0xe4 & 2) >> 1 ^ visible,
     *(ushort *)&this_00->field_0x2d0 =
          (ushort)*(undefined4 *)&this_00->field_0x2d0 & 0xfffe | (ushort)bVar2, bVar2 == 1)) {
    pTVar3->field_0xe4 = pTVar3->field_0xe4 & 0xfd | visible * '\x02';
    pQVar1 = pTVar3->leftWidget;
    if (pQVar1 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,visible);
    }
    pQVar1 = pTVar3->rightWidget;
    if (pQVar1 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,visible);
    }
    QWidget::setShortcutEnabled(&this->super_QWidget,pTVar3->shortcutId,visible);
    QTabBarPrivate::calculateFirstLastVisible(this_00,index,visible,false);
    if ((!visible) && (this_00->currentIndex == index)) {
      index_00 = QTabBarPrivate::selectNewCurrentIndexFrom(this_00,index + 1);
      setCurrentIndex(this,index_00);
    }
    QWidget::update(&this->super_QWidget);
    return;
  }
  return;
}

Assistant:

void QTabBar::setTabVisible(int index, bool visible)
{
    Q_D(QTabBar);
    if (QTabBarPrivate::Tab *tab = d->at(index)) {
        d->layoutDirty = (visible != tab->visible);
        if (!d->layoutDirty)
            return;
        tab->visible = visible;
        if (tab->leftWidget)
            tab->leftWidget->setVisible(visible);
        if (tab->rightWidget)
            tab->rightWidget->setVisible(visible);
#ifndef QT_NO_SHORTCUT
        setShortcutEnabled(tab->shortcutId, visible);
#endif
        d->calculateFirstLastVisible(index, visible, false);
        if (!visible && index == d->currentIndex) {
            const int newindex = d->selectNewCurrentIndexFrom(index+1);
            setCurrentIndex(newindex);
        }
        update();
    }
}